

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_scalar(upb_encstate *e,void *_field_mem,upb_MiniTableSubInternal *subs,
                  upb_MiniTableField *f)

{
  uint uVar1;
  ulong val_00;
  upb_TaggedMessagePtr tagged;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t val_01;
  upb_MiniTable *m;
  upb_MiniTable *subm_1;
  upb_TaggedMessagePtr submsg_1;
  size_t size_1;
  upb_MiniTable *subm;
  upb_TaggedMessagePtr submsg;
  size_t size;
  upb_StringView view;
  int64_t val_9;
  int32_t val_8;
  _Bool val_7;
  uint32_t val_6;
  uint64_t val_5;
  int32_t val_4;
  uint32_t val_3;
  uint64_t val_2;
  float val_1;
  double val;
  int wire_type;
  char *field_mem;
  upb_MiniTableField *f_local;
  upb_MiniTableSubInternal *subs_local;
  void *_field_mem_local;
  upb_encstate *e_local;
  
  switch(f->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
    encode_double(e,*_field_mem);
    val._4_1_ = '\x01';
    break;
  case '\x02':
    encode_float(e,*_field_mem);
    val._4_1_ = '\x05';
    break;
  case '\x03':
  case '\x04':
    val_00 = *_field_mem;
    if ((val_00 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)val_00;
    }
    else {
      encode_longvarint(e,val_00);
    }
    val._4_1_ = '\0';
    break;
  case '\x05':
  case '\x0e':
    iVar3 = *_field_mem;
    if (((ulong)(long)iVar3 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)iVar3;
    }
    else {
      encode_longvarint(e,(long)iVar3);
    }
    val._4_1_ = '\0';
    break;
  case '\x06':
  case '\x10':
    encode_fixed64(e,*_field_mem);
    val._4_1_ = '\x01';
    break;
  case '\a':
  case '\x0f':
    encode_fixed32(e,*_field_mem);
    val._4_1_ = '\x05';
    break;
  case '\b':
    bVar2 = *_field_mem & 1;
    if (((ulong)bVar2 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = bVar2;
    }
    else {
      encode_longvarint(e,(ulong)bVar2);
    }
    val._4_1_ = '\0';
    break;
  case '\t':
  case '\f':
    size = *_field_mem;
    view.data = *(char **)((long)_field_mem + 8);
    encode_bytes(e,(void *)size,(size_t)view.data);
    if ((view.data < (char *)0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)view.data;
    }
    else {
      encode_longvarint(e,(uint64_t)view.data);
    }
    val._4_1_ = '\x02';
    break;
  case '\n':
    subm = *_field_mem;
    size_1 = (size_t)_upb_Encoder_GetSubMiniTable(subs,f);
    if (subm == (upb_MiniTable *)0x0) {
      return;
    }
    iVar3 = e->depth + -1;
    e->depth = iVar3;
    if (iVar3 == 0) {
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    uVar4 = upb_MiniTableField_Number(f);
    encode_tag(e,uVar4,'\x04');
    encode_TaggedMessagePtr(e,(upb_TaggedMessagePtr)subm,(upb_MiniTable *)size_1,&submsg);
    val._4_1_ = '\x03';
    e->depth = e->depth + 1;
    break;
  case '\v':
    tagged = *_field_mem;
    m = _upb_Encoder_GetSubMiniTable(subs,f);
    if (tagged == 0) {
      return;
    }
    iVar3 = e->depth + -1;
    e->depth = iVar3;
    if (iVar3 == 0) {
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    encode_TaggedMessagePtr(e,tagged,m,&submsg_1);
    if ((submsg_1 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)submsg_1;
    }
    else {
      encode_longvarint(e,submsg_1);
    }
    val._4_1_ = '\x02';
    e->depth = e->depth + 1;
    break;
  case '\r':
    uVar1 = *_field_mem;
    if (((ulong)uVar1 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)uVar1;
    }
    else {
      encode_longvarint(e,(ulong)uVar1);
    }
    val._4_1_ = '\0';
    break;
  case '\x11':
    uVar4 = encode_zz32(*_field_mem);
    if (((ulong)uVar4 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)uVar4;
    }
    else {
      encode_longvarint(e,(ulong)uVar4);
    }
    val._4_1_ = '\0';
    break;
  case '\x12':
    view.size = *_field_mem;
    val_01 = encode_zz64(view.size);
    if ((val_01 < 0x80) && (e->ptr != e->buf)) {
      e->ptr = e->ptr + -1;
      *e->ptr = (char)val_01;
    }
    else {
      encode_longvarint(e,val_01);
    }
    val._4_1_ = '\0';
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/encode.c"
                  ,0x135,
                  "void encode_scalar(upb_encstate *, const void *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  uVar4 = upb_MiniTableField_Number(f);
  encode_tag(e,uVar4,val._4_1_);
  return;
}

Assistant:

static void encode_scalar(upb_encstate* e, const void* _field_mem,
                          const upb_MiniTableSubInternal* subs,
                          const upb_MiniTableField* f) {
  const char* field_mem = _field_mem;
  int wire_type;

#define CASE(ctype, type, wtype, encodeval) \
  {                                         \
    ctype val = *(ctype*)field_mem;         \
    encode_##type(e, encodeval);            \
    wire_type = wtype;                      \
    break;                                  \
  }

  switch (f->UPB_PRIVATE(descriptortype)) {
    case kUpb_FieldType_Double:
      CASE(double, double, kUpb_WireType_64Bit, val);
    case kUpb_FieldType_Float:
      CASE(float, float, kUpb_WireType_32Bit, val);
    case kUpb_FieldType_Int64:
    case kUpb_FieldType_UInt64:
      CASE(uint64_t, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_UInt32:
      CASE(uint32_t, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_Int32:
    case kUpb_FieldType_Enum:
      CASE(int32_t, varint, kUpb_WireType_Varint, (int64_t)val);
    case kUpb_FieldType_SFixed64:
    case kUpb_FieldType_Fixed64:
      CASE(uint64_t, fixed64, kUpb_WireType_64Bit, val);
    case kUpb_FieldType_Fixed32:
    case kUpb_FieldType_SFixed32:
      CASE(uint32_t, fixed32, kUpb_WireType_32Bit, val);
    case kUpb_FieldType_Bool:
      CASE(bool, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_SInt32:
      CASE(int32_t, varint, kUpb_WireType_Varint, encode_zz32(val));
    case kUpb_FieldType_SInt64:
      CASE(int64_t, varint, kUpb_WireType_Varint, encode_zz64(val));
    case kUpb_FieldType_String:
    case kUpb_FieldType_Bytes: {
      upb_StringView view = *(upb_StringView*)field_mem;
      encode_bytes(e, view.data, view.size);
      encode_varint(e, view.size);
      wire_type = kUpb_WireType_Delimited;
      break;
    }
    case kUpb_FieldType_Group: {
      size_t size;
      upb_TaggedMessagePtr submsg = *(upb_TaggedMessagePtr*)field_mem;
      const upb_MiniTable* subm = _upb_Encoder_GetSubMiniTable(subs, f);
      if (submsg == 0) {
        return;
      }
      if (--e->depth == 0) encode_err(e, kUpb_EncodeStatus_MaxDepthExceeded);
      encode_tag(e, upb_MiniTableField_Number(f), kUpb_WireType_EndGroup);
      encode_TaggedMessagePtr(e, submsg, subm, &size);
      wire_type = kUpb_WireType_StartGroup;
      e->depth++;
      break;
    }
    case kUpb_FieldType_Message: {
      size_t size;
      upb_TaggedMessagePtr submsg = *(upb_TaggedMessagePtr*)field_mem;
      const upb_MiniTable* subm = _upb_Encoder_GetSubMiniTable(subs, f);
      if (submsg == 0) {
        return;
      }
      if (--e->depth == 0) encode_err(e, kUpb_EncodeStatus_MaxDepthExceeded);
      encode_TaggedMessagePtr(e, submsg, subm, &size);
      encode_varint(e, size);
      wire_type = kUpb_WireType_Delimited;
      e->depth++;
      break;
    }
    default:
      UPB_UNREACHABLE();
  }
#undef CASE

  encode_tag(e, upb_MiniTableField_Number(f), wire_type);
}